

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemReadIOCallback.cpp
# Opt level: O0

void __thiscall
libebml::MemReadIOCallback::MemReadIOCallback(MemReadIOCallback *this,EbmlBinary *Binary)

{
  int iVar1;
  binary *Ptr;
  undefined4 extraout_var;
  EbmlBinary *Binary_local;
  MemReadIOCallback *this_local;
  
  IOCallback::IOCallback(&this->super_IOCallback);
  (this->super_IOCallback)._vptr_IOCallback = (_func_int **)&PTR__MemReadIOCallback_002423e0;
  Ptr = EbmlBinary::GetBuffer(Binary);
  iVar1 = (*(Binary->super_EbmlElement)._vptr_EbmlElement[9])();
  Init(this,Ptr,CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

MemReadIOCallback::MemReadIOCallback(EbmlBinary const &Binary) {
  Init(Binary.GetBuffer(), Binary.GetSize());
}